

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O2

char * vrna_ptypes(short *S,vrna_md_t *md)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  int *__ptr;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint length;
  long lVar12;
  int iVar13;
  int iVar14;
  
  length = (uint)*S;
  if (*S < 0) {
    pcVar3 = (char *)0x0;
    vrna_message_warning
              ("vrna_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
               (ulong)length);
  }
  else {
    iVar2 = md->min_loop_size;
    pcVar3 = (char *)vrna_alloc(((length + 1) * length >> 1) + 2);
    __ptr = vrna_idx_col_wise(length);
    lVar4 = (long)(int)length;
    iVar5 = iVar2 + 2;
    for (uVar9 = 1; (long)uVar9 < (long)(int)(length - iVar2); uVar9 = uVar9 + 1) {
      iVar6 = iVar5;
      for (lVar11 = 1; lVar11 != 3; lVar11 = lVar11 + 1) {
        lVar1 = uVar9 + (long)iVar2 + lVar11;
        if (lVar1 <= lVar4) {
          iVar7 = 0;
          iVar13 = 0;
          uVar10 = uVar9;
          iVar8 = md->pair[S[uVar9]][S[lVar1]];
          for (lVar12 = (long)iVar6; (0 < (long)uVar10 && (lVar12 <= lVar4)); lVar12 = lVar12 + 1) {
            if ((1 < uVar10) && (lVar12 < lVar4)) {
              iVar7 = md->pair[S[uVar10 - 1]][S[lVar12 + 1]];
            }
            iVar14 = 0;
            if (iVar13 != 0 || iVar7 != 0) {
              iVar14 = iVar8;
            }
            iVar13 = iVar14;
            if (md->noLP == 0) {
              iVar13 = iVar8;
            }
            pcVar3[__ptr[lVar12] + (int)uVar10] = (char)iVar13;
            uVar10 = uVar10 - 1;
            iVar8 = iVar7;
          }
        }
        iVar6 = iVar6 + 1;
      }
      iVar5 = iVar5 + 1;
    }
    free(__ptr);
  }
  return pcVar3;
}

Assistant:

PUBLIC char *
vrna_ptypes(const short *S,
            vrna_md_t   *md)
{
  char  *ptype;
  int   n, i, j, k, l, *idx;
  int   min_loop_size = md->min_loop_size;

  n = S[0];

  if ((unsigned int)n > vrna_sequence_length_max(VRNA_OPTION_DEFAULT)) {
    vrna_message_warning("vrna_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
                         n);
    return NULL;
  }

  ptype = (char *)vrna_alloc(sizeof(char) * ((n * (n + 1)) / 2 + 2));
  idx   = vrna_idx_col_wise(n);

  for (k = 1; k < n - min_loop_size; k++)
    for (l = 1; l <= 2; l++) {
      int type, ntype = 0, otype = 0;
      i = k;
      j = i + min_loop_size + l;
      if (j > n)
        continue;

      type = md->pair[S[i]][S[j]];
      while ((i >= 1) && (j <= n)) {
        if ((i > 1) && (j < n))
          ntype = md->pair[S[i - 1]][S[j + 1]];

        if (md->noLP && (!otype) && (!ntype))
          type = 0; /* i.j can only form isolated pairs */

        ptype[idx[j] + i] = (char)type;
        otype             = type;
        type              = ntype;
        i--;
        j++;
      }
    }
  free(idx);
  return ptype;
}